

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O0

NeuralNetwork *
addInnerProductLayer
          (Model *m,bool isUpdatable,char *name,TensorAttributes *inTensorAttr,
          TensorAttributes *outTensorAttr,bool areWeightsQuantized,bool isBiasQuantized)

{
  TensorAttributes *pTVar1;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  Arena *pAVar2;
  InnerProductLayerParams *this_01;
  WeightParams *pWVar3;
  QuantizationParams *pQVar4;
  LinearQuantizationParams *pLVar5;
  LinearQuantizationParams *linear_quant_params_1;
  QuantizationParams *quant_params_1;
  WeightParams *bias;
  LinearQuantizationParams *linear_quant_params;
  QuantizationParams *quant_params;
  WeightParams *weights;
  InnerProductLayerParams *innerProductParams;
  NeuralNetworkLayer *layer;
  NeuralNetwork *neuralNet;
  bool isBiasQuantized_local;
  bool areWeightsQuantized_local;
  TensorAttributes *outTensorAttr_local;
  TensorAttributes *inTensorAttr_local;
  char *name_local;
  Model *pMStack_40;
  bool isUpdatable_local;
  Model *m_local;
  WeightParams *local_30;
  char *local_28;
  WeightParams *local_20;
  TensorAttributes **local_18;
  NeuralNetworkLayer *local_10;
  
  inTensorAttr_local = (TensorAttributes *)name;
  name_local._7_1_ = isUpdatable;
  pMStack_40 = m;
  this = CoreML::Specification::Model::mutable_neuralnetwork(m);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  pTVar1 = inTensorAttr_local;
  local_18 = &inTensorAttr_local;
  local_10 = this_00;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this_00->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&this_00->name_,pTVar1,pAVar2);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,inTensorAttr->name);
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,outTensorAttr->name);
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this_00);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels(this_01,1);
  CoreML::Specification::InnerProductLayerParams::set_outputchannels(this_01,1);
  pWVar3 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_01);
  if (areWeightsQuantized) {
    pQVar4 = CoreML::Specification::WeightParams::mutable_quantization(pWVar3);
    CoreML::Specification::QuantizationParams::set_numberofbits(pQVar4,1);
    pLVar5 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar4);
    CoreML::Specification::LinearQuantizationParams::add_scale(pLVar5,1.0);
    CoreML::Specification::LinearQuantizationParams::add_bias(pLVar5,0.0);
    local_28 = "x01";
    local_20 = pWVar3;
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&pWVar3->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::
    SetBytes<google::protobuf::internal::ArenaStringPtr::EmptyDefault,char_const(&)[4]>
              (&pWVar3->int8rawvalue_,"x01",pAVar2);
  }
  else {
    CoreML::Specification::WeightParams::add_floatvalue(pWVar3,1.0);
  }
  CoreML::Specification::InnerProductLayerParams::set_hasbias(this_01,true);
  pWVar3 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_01);
  if (isBiasQuantized) {
    pQVar4 = CoreML::Specification::WeightParams::mutable_quantization(pWVar3);
    CoreML::Specification::QuantizationParams::set_numberofbits(pQVar4,1);
    pLVar5 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar4);
    CoreML::Specification::LinearQuantizationParams::add_scale(pLVar5,1.0);
    CoreML::Specification::LinearQuantizationParams::add_bias(pLVar5,0.0);
    m_local = (Model *)anon_var_dwarf_110b0c;
    local_30 = pWVar3;
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&pWVar3->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::
    SetBytes<google::protobuf::internal::ArenaStringPtr::EmptyDefault,char_const(&)[4]>
              (&pWVar3->int8rawvalue_,"x01",pAVar2);
  }
  else {
    CoreML::Specification::WeightParams::add_floatvalue(pWVar3,1.0);
  }
  if ((name_local._7_1_ & 1) != 0) {
    CoreML::Specification::NeuralNetworkLayer::set_isupdatable(this_00,true);
    pWVar3 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_01);
    CoreML::Specification::WeightParams::set_isupdatable(pWVar3,true);
    pWVar3 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_01);
    CoreML::Specification::WeightParams::set_isupdatable(pWVar3,true);
  }
  return this;
}

Assistant:

Specification::NeuralNetwork* addInnerProductLayer(Specification::Model& m, bool isUpdatable, const char *name, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, bool areWeightsQuantized, bool isBiasQuantized) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto layer = neuralNet->add_layers();
    
    layer->set_name(name);
    layer->add_input(inTensorAttr->name);
    layer->add_output(outTensorAttr->name);
    Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);

    // set weight
    auto* weights = innerProductParams->mutable_weights();
    if (areWeightsQuantized) {
        auto *quant_params = weights->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        weights->set_int8rawvalue("x01"); // this is [1]
    } else {
        weights->add_floatvalue(1.0);
    }

    // set bias
    innerProductParams->set_hasbias(true);
    auto* bias = innerProductParams->mutable_bias();
    if (isBiasQuantized) {
        auto *quant_params = bias->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        bias->set_int8rawvalue("x01"); // this is [1]
    } else {
        bias->add_floatvalue(1.0);
    }
    
    if (isUpdatable) {
        layer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        innerProductParams->mutable_bias()->set_isupdatable(true);
    }

    return neuralNet;
}